

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O3

optional<pbrt::ShapeIntersection> * __thiscall
pbrt::Disk::Intersect
          (optional<pbrt::ShapeIntersection> *__return_storage_ptr__,Disk *this,Ray *ray,Float tMax)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  optional<pbrt::QuadricIntersection> isect;
  SurfaceInteraction intr;
  aligned_storage_t<sizeof(pbrt::QuadricIntersection),_alignof(pbrt::QuadricIntersection)> local_140
  ;
  char local_12c;
  Tuple3<pbrt::Vector3,_float> local_128;
  SurfaceInteraction local_118;
  
  BasicIntersect((optional<pbrt::QuadricIntersection> *)&local_140.__align,this,ray,tMax);
  if (local_12c == '\0') {
    *(undefined8 *)&__return_storage_ptr__->set = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xc0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 200) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x90) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x98) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x70) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x78) = 0;
    (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  }
  else {
    uVar1._0_4_ = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
    uVar1._4_4_ = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
    auVar2._0_8_ = uVar1 ^ 0x8000000080000000;
    auVar2._8_4_ = 0x80000000;
    auVar2._12_4_ = 0x80000000;
    local_128.z = -(ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
    local_128._0_8_ = vmovlps_avx(auVar2);
    InteractionFromIntersection
              (&local_118,this,(QuadricIntersection *)&local_140.__align,(Vector3f *)&local_128,
               ray->time);
    if (local_12c == '\0') {
      LogFatal<char_const(&)[4]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                 ,0xea,"Check failed: %s",(char (*) [4])0x28683bc);
    }
    __return_storage_ptr__->set = true;
    *(MediumInterface **)((long)&__return_storage_ptr__->optionalValue + 0x40) =
         local_118.super_Interaction.mediumInterface;
    (__return_storage_ptr__->optionalValue).__align =
         (anon_struct_8_0_00000001_for___align)
         local_118.super_Interaction.pi.super_Point3<pbrt::Interval>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
    *(Interval *)((long)&__return_storage_ptr__->optionalValue + 8) =
         local_118.super_Interaction.pi.super_Point3<pbrt::Interval>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval>.y;
    *(Interval *)((long)&__return_storage_ptr__->optionalValue + 0x10) =
         local_118.super_Interaction.pi.super_Point3<pbrt::Interval>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) =
         local_118.super_Interaction._24_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) =
         local_118.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>._4_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) =
         local_118.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) =
         local_118.super_Interaction._48_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) =
         local_118.super_Interaction._56_8_;
    ((TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
      *)((long)&__return_storage_ptr__->optionalValue + 0x48))->bits =
         (uintptr_t)
         local_118.super_Interaction.medium.
         super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
         .bits;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) =
         local_118.dpdu.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = local_118._88_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) =
         local_118.dpdv.super_Tuple3<pbrt::Vector3,_float>._4_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) =
         local_118.dndu.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x70) = local_118._112_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x78) =
         local_118.dndv.super_Tuple3<pbrt::Normal3,_float>._4_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) =
         local_118.shading.n.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = local_118.shading._8_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) =
         local_118.shading.n.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = local_118.shading._8_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x90) =
         local_118.shading.dpdu.super_Tuple3<pbrt::Vector3,_float>._4_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x98) =
         local_118.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa0) = local_118.shading._32_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa8) =
         local_118.shading.dndu.super_Tuple3<pbrt::Normal3,_float>._4_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb0) =
         local_118.shading.dndv.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb8) = local_118._184_8_;
    ((TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
      *)((long)&__return_storage_ptr__->optionalValue + 0xc0))->bits =
         (uintptr_t)
         local_118.material.
         super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
         .bits;
    ((TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
      *)((long)&__return_storage_ptr__->optionalValue + 200))->bits =
         (uintptr_t)
         local_118.areaLight.
         super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
         .bits;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf0) = local_118._240_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd0) =
         local_118.dpdx.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd8) = local_118._216_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe0) =
         local_118.dpdy.super_Tuple3<pbrt::Vector3,_float>._4_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe8) = local_118._232_8_;
    *(anon_struct_4_0_00000001_for___align *)((long)&__return_storage_ptr__->optionalValue + 0xf8) =
         local_140.__align;
  }
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<ShapeIntersection> Intersect(const Ray &ray,
                                                Float tMax = Infinity) const {
        pstd::optional<QuadricIntersection> isect = BasicIntersect(ray, tMax);
        if (!isect)
            return {};
        SurfaceInteraction intr = InteractionFromIntersection(*isect, -ray.d, ray.time);
        return ShapeIntersection{intr, isect->tHit};
    }